

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O1

int lws_alpn_comma_to_openssl(char *comma,uint8_t *os,int len)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t uVar3;
  bool bVar4;
  
  iVar2 = (int)os;
  if (comma == (char *)0x0) {
    return 0;
  }
  bVar4 = 2 < len;
  uVar3 = *comma;
  if (uVar3 == '\0' || len < 3) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    puVar1 = (uint8_t *)0x0;
    do {
      while ((comma = (char *)((uint8_t *)comma + 1), puVar1 != (uint8_t *)0x0 || (uVar3 != ' '))) {
        bVar4 = puVar1 == (uint8_t *)0x0;
        if (bVar4) {
          puVar1 = os;
        }
        os = os + bVar4;
        len = len - (uint)bVar4;
        if (uVar3 == ',') {
          *puVar1 = ~(byte)puVar1 + (char)os;
          puVar1 = (uint8_t *)0x0;
        }
        else {
          *os = uVar3;
          os = os + 1;
          len = len + -1;
        }
        bVar4 = 2 < len;
        uVar3 = *comma;
        if ((uVar3 == '\0') || (len < 3)) goto LAB_00133dda;
      }
      uVar3 = *comma;
      puVar1 = (uint8_t *)0x0;
    } while ((bool)(uVar3 != '\0' & bVar4));
    puVar1 = (uint8_t *)0x0;
  }
LAB_00133dda:
  if (puVar1 != (uint8_t *)0x0) {
    *puVar1 = ~(byte)puVar1 + (char)os;
  }
  *os = '\0';
  return (int)os - iVar2;
}

Assistant:

int
lws_alpn_comma_to_openssl(const char *comma, uint8_t *os, int len)
{
	uint8_t *oos = os, *plen = NULL;

	if (!comma)
		return 0;

	while (*comma && len > 2) {
		if (!plen && *comma == ' ') {
			comma++;
			continue;
		}
		if (!plen) {
			plen = os++;
			len--;
		}

		if (*comma == ',') {
			*plen = (uint8_t)lws_ptr_diff(os, plen + 1);
			plen = NULL;
			comma++;
		} else {
			*os++ = (uint8_t)*comma++;
			len--;
		}
	}

	if (plen)
		*plen = (uint8_t)lws_ptr_diff(os, plen + 1);

	*os = 0;

	return lws_ptr_diff(os, oos);
}